

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O2

void __thiscall
cppjieba::DictTrie::Init
          (DictTrie *this,string *dict_path,string *user_dict_paths,
          UserWordWeightOption user_word_weight_opt)

{
  double sum;
  
  LoadDict(this,dict_path);
  sum = CalcFreqSum(this,&this->static_node_infos_);
  this->freq_sum_ = sum;
  CalculateWeight(this,&this->static_node_infos_,sum);
  SetStaticWordWeights(this,user_word_weight_opt);
  if (user_dict_paths->_M_string_length != 0) {
    LoadUserDict(this,user_dict_paths);
  }
  Shrink(this,&this->static_node_infos_);
  CreateTrie(this,&this->static_node_infos_);
  return;
}

Assistant:

void Init(const string& dict_path, const string& user_dict_paths, UserWordWeightOption user_word_weight_opt) {
    LoadDict(dict_path);
    freq_sum_ = CalcFreqSum(static_node_infos_);
    CalculateWeight(static_node_infos_, freq_sum_);
    SetStaticWordWeights(user_word_weight_opt);

    if (user_dict_paths.size()) {
      LoadUserDict(user_dict_paths);
    }
    Shrink(static_node_infos_);
    CreateTrie(static_node_infos_);
  }